

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

void get_sesslist(sesslist *list,_Bool allocate)

{
  _Bool _Var1;
  int iVar2;
  strbuf *out;
  settings_e *handle_00;
  char *pcVar3;
  char **ppcVar4;
  strbuf *sb;
  settings_e *handle;
  char *p;
  int i;
  _Bool allocate_local;
  sesslist *list_local;
  
  if (allocate) {
    out = strbuf_new();
    if ((sesslist_demo_mode & 1U) == 0) {
      handle_00 = enum_settings_start();
      if (handle_00 != (settings_e *)0x0) {
        while (_Var1 = enum_settings_next(handle_00,out), _Var1) {
          BinarySink_put_byte(out->binarysink_,'\0');
        }
        enum_settings_finish(handle_00);
      }
      BinarySink_put_byte(out->binarysink_,'\0');
    }
    else {
      BinarySink_put_asciz(out->binarysink_,"demo-server");
      BinarySink_put_asciz(out->binarysink_,"demo-server-2");
    }
    pcVar3 = strbuf_to_str(out);
    list->buffer = pcVar3;
    handle = (settings_e *)list->buffer;
    list->nsessions = 1;
    for (; *(char *)&handle->dp != '\0'; handle = (settings_e *)((long)&handle->dp + 1)) {
      iVar2 = strcmp((char *)handle,"Default Settings");
      if (iVar2 != 0) {
        list->nsessions = list->nsessions + 1;
      }
      for (; *(char *)&handle->dp != '\0'; handle = (settings_e *)((long)&handle->dp + 1)) {
      }
    }
    ppcVar4 = (char **)safemalloc((long)(list->nsessions + 1),8,0);
    list->sessions = ppcVar4;
    *list->sessions = "Default Settings";
    handle = (settings_e *)list->buffer;
    p._0_4_ = 1;
    for (; *(char *)&handle->dp != '\0'; handle = (settings_e *)((long)&handle->dp + 1)) {
      iVar2 = strcmp((char *)handle,"Default Settings");
      if (iVar2 != 0) {
        list->sessions[(int)p] = (char *)handle;
        p._0_4_ = (int)p + 1;
      }
      for (; *(char *)&handle->dp != '\0'; handle = (settings_e *)((long)&handle->dp + 1)) {
      }
    }
    qsort(list->sessions,(long)(int)p,8,sessioncmp);
  }
  else {
    safefree(list->buffer);
    safefree(list->sessions);
    list->buffer = (char *)0x0;
    list->sessions = (char **)0x0;
  }
  return;
}

Assistant:

void get_sesslist(struct sesslist *list, bool allocate)
{
    int i;
    char *p;
    settings_e *handle;

    if (allocate) {
        strbuf *sb = strbuf_new();

        if (sesslist_demo_mode) {
            put_asciz(sb, "demo-server");
            put_asciz(sb, "demo-server-2");
        } else {
            if ((handle = enum_settings_start()) != NULL) {
                while (enum_settings_next(handle, sb))
                    put_byte(sb, '\0');
                enum_settings_finish(handle);
            }
            put_byte(sb, '\0');
        }

        list->buffer = strbuf_to_str(sb);

        /*
         * Now set up the list of sessions. Note that "Default
         * Settings" must always be claimed to exist, even if it
         * doesn't really.
         */

        p = list->buffer;
        list->nsessions = 1;           /* "Default Settings" counts as one */
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->nsessions++;
            while (*p)
                p++;
            p++;
        }

        list->sessions = snewn(list->nsessions + 1, const char *);
        list->sessions[0] = "Default Settings";
        p = list->buffer;
        i = 1;
        while (*p) {
            if (strcmp(p, "Default Settings"))
                list->sessions[i++] = p;
            while (*p)
                p++;
            p++;
        }

        qsort(list->sessions, i, sizeof(const char *), sessioncmp);
    } else {
        sfree(list->buffer);
        sfree(list->sessions);
        list->buffer = NULL;
        list->sessions = NULL;
    }
}